

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O2

void __thiscall QHttpThreadDelegate::readBufferSizeChanged(QHttpThreadDelegate *this,qint64 size)

{
  if (*(QHttpNetworkReply **)(this + 0x150) != (QHttpNetworkReply *)0x0) {
    QHttpNetworkReply::setDownstreamLimited(*(QHttpNetworkReply **)(this + 0x150),0 < size);
    QHttpNetworkReply::setReadBufferSize(*(QHttpNetworkReply **)(this + 0x150),size);
    *(qint64 *)(this + 0x38) = size;
  }
  return;
}

Assistant:

void QHttpThreadDelegate::readBufferSizeChanged(qint64 size)
{
#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::readBufferSizeChanged() size " << size;
#endif
    if (httpReply) {
        httpReply->setDownstreamLimited(size > 0);
        httpReply->setReadBufferSize(size);
        readBufferMaxSize = size;
    }
}